

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::write<std::__cxx11::string,std::__cxx11::string,char[100],char_const*>
          (BasicWriter<char> *this,BasicCStringRef<char> arg0,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [100],char **args_3)

{
  uint64_t types;
  ArgList local_90;
  char *local_80;
  undefined1 local_78 [8];
  Type array;
  char **args_local_3;
  char (*args_local_2) [100];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  BasicWriter<char> *this_local;
  BasicCStringRef<char> arg0_local;
  
  array[3].field_0._8_8_ = args_3;
  _local_78 = (StringValue<char>)
              internal::ArgArray<4ul,true>::
              make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,std::__cxx11::string>(args);
  array._8_16_ = (undefined1  [16])
                 internal::ArgArray<4ul,true>::
                 make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,std::__cxx11::string>
                           (args_1);
  array._24_16_ =
       (undefined1  [16])
       internal::ArgArray<4ul,true>::
       make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,char[100]>(args_2);
  array._40_16_ =
       (undefined1  [16])
       internal::ArgArray<4ul,true>::
       make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,char_const*>
                 ((char **)array[3].field_0._8_8_);
  local_80 = arg0.data_;
  types = internal::make_type<std::__cxx11::string,std::__cxx11::string,char[100],char_const*>
                    (args,args_1,args_2,(char **)array[3].field_0._8_8_);
  ArgList::ArgList(&local_90,types,(Value *)local_78);
  write(this,(int)local_80,(void *)local_90.types_,(size_t)local_90.field_1);
  return;
}

Assistant:

BasicWriter &operator<<(int value)
    {
        write_decimal(value);
        return *this;
    }